

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSwitch.c
# Opt level: O0

void Gia_ManSwiSimInfoRandom(Gia_ManSwi_t *p,uint *pInfo,int nProbNum)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int local_28;
  int local_24;
  int i;
  int w;
  uint Mask;
  int nProbNum_local;
  uint *pInfo_local;
  Gia_ManSwi_t *p_local;
  
  if (nProbNum == -1) {
    uVar1 = Gia_ManRandom(0);
    uVar2 = Gia_ManRandom(0);
    uVar3 = Gia_ManRandom(0);
    uVar4 = Gia_ManRandom(0);
    uVar5 = Gia_ManRandom(0);
    local_24 = p->nWords;
    while (local_24 = local_24 + -1, -1 < local_24) {
      pInfo[local_24] = (uVar1 & uVar2 | uVar3 & uVar4 & uVar5) ^ pInfo[local_24];
    }
  }
  else if (nProbNum < 1) {
    if (nProbNum != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSwitch.c"
                    ,0xac,"void Gia_ManSwiSimInfoRandom(Gia_ManSwi_t *, unsigned int *, int)");
    }
    local_24 = p->nWords;
    while (local_24 = local_24 + -1, -1 < local_24) {
      uVar1 = Gia_ManRandom(0);
      pInfo[local_24] = uVar1;
    }
  }
  else {
    i = Gia_ManRandom(0);
    for (local_28 = 0; local_28 < nProbNum; local_28 = local_28 + 1) {
      uVar1 = Gia_ManRandom(0);
      i = uVar1 & i;
    }
    local_24 = p->nWords;
    while (local_24 = local_24 + -1, -1 < local_24) {
      pInfo[local_24] = i ^ pInfo[local_24];
    }
  }
  return;
}

Assistant:

static inline void Gia_ManSwiSimInfoRandom( Gia_ManSwi_t * p, unsigned * pInfo, int nProbNum )
{
    unsigned Mask = 0;
    int w, i;
    if ( nProbNum == -1 )
    { // 3/8 = 1/4 + 1/8
        Mask = (Gia_ManRandom( 0 ) & Gia_ManRandom( 0 )) | 
               (Gia_ManRandom( 0 ) & Gia_ManRandom( 0 ) & Gia_ManRandom( 0 ));
        for ( w = p->nWords-1; w >= 0; w-- )
            pInfo[w] ^= Mask;
    }
    else if ( nProbNum > 0 )
    {
        Mask = Gia_ManRandom( 0 );
        for ( i = 0; i < nProbNum; i++ )
            Mask &= Gia_ManRandom( 0 );
        for ( w = p->nWords-1; w >= 0; w-- )
            pInfo[w] ^= Mask;
    }
    else if ( nProbNum == 0 )
    {
        for ( w = p->nWords-1; w >= 0; w-- )
            pInfo[w] = Gia_ManRandom( 0 );
    }
    else
        assert( 0 );
}